

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int archive_write_set_format_xar(archive *_a)

{
  int iVar1;
  undefined4 *__ptr;
  file *pfVar2;
  char *pathname;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_xar");
  if (iVar1 != -0x1e) {
    if ((code *)_a[2].archive_format_name != (code *)0x0) {
      (*(code *)_a[2].archive_format_name)(_a);
    }
    __ptr = (undefined4 *)calloc(1,0x101c8);
    if (__ptr != (undefined4 *)0x0) {
      *__ptr = 0xffffffff;
      *(undefined4 **)(__ptr + 0x406c) = __ptr + 0x406a;
      __archive_rb_tree_init
                ((archive_rb_tree *)(__ptr + 0x406e),
                 (archive_rb_tree_ops *)file_init_hardlinks_rb_ops);
      *(undefined8 *)(__ptr + 0x1c) = 0;
      *(undefined8 *)(__ptr + 0x1e) = 0;
      *(undefined8 *)(__ptr + 0x18) = 0;
      *(undefined8 *)(__ptr + 0x1a) = 0;
      *(undefined8 *)(__ptr + 0x14) = 0;
      *(undefined8 *)(__ptr + 0x16) = 0;
      pfVar2 = file_create_virtual_dir((archive_write *)_a,(xar_conflict *)0x174f4a,pathname);
      *(file **)(__ptr + 6) = pfVar2;
      if (pfVar2 != (file *)0x0) {
        pfVar2->parent = pfVar2;
        iVar1 = __ptr[4];
        __ptr[4] = iVar1 + 1;
        pfVar2->id = iVar1;
        pfVar2->next = (file *)0x0;
        **(undefined8 **)(__ptr + 0x406c) = pfVar2;
        *(file ***)(__ptr + 0x406c) = &pfVar2->next;
        *(undefined8 *)(__ptr + 8) = *(undefined8 *)(__ptr + 6);
        *(undefined8 *)(__ptr + 10) = 0;
        *(undefined8 *)(__ptr + 0xc) = 0;
        *(undefined8 *)(__ptr + 0xe) = 0;
        archive_string_ensure((archive_string *)(__ptr + 10),1);
        **(undefined1 **)(__ptr + 10) = 0;
        *(undefined8 *)(__ptr + 0x20) = 0x100000001;
        *(undefined8 *)(__ptr + 0x22) = 0x600000001;
        __ptr[0x24] = 1;
        _a[1].read_data_offset = (int64_t)__ptr;
        _a[1].read_data_output_offset = (int64_t)"xar";
        *(code **)&_a[1].read_data_is_posix_read = xar_options;
        *(code **)(_a + 2) = xar_write_header;
        _a[2].vtable = (archive_vtable_conflict *)xar_write_data;
        _a[1].read_data_requested = (size_t)xar_finish_entry;
        *(code **)&_a[2].archive_format = xar_close;
        _a[2].archive_format_name = (char *)xar_free;
        _a->archive_format = 0xa0000;
        _a->archive_format_name = "xar";
        return 0;
      }
      free(__ptr);
    }
    archive_set_error(_a,0xc,"Can\'t allocate xar data");
  }
  return -0x1e;
}

Assistant:

int
archive_write_set_format_xar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct xar *xar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_xar");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	xar = calloc(1, sizeof(*xar));
	if (xar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate xar data");
		return (ARCHIVE_FATAL);
	}
	xar->temp_fd = -1;
	file_init_register(xar);
	file_init_hardlinks(xar);
	archive_string_init(&(xar->tstr));
	archive_string_init(&(xar->vstr));

	/*
	 * Create the root directory.
	 */
	xar->root = file_create_virtual_dir(a, xar, "");
	if (xar->root == NULL) {
		free(xar);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate xar data");
		return (ARCHIVE_FATAL);
	}
	xar->root->parent = xar->root;
	file_register(xar, xar->root);
	xar->cur_dirent = xar->root;
	archive_string_init(&(xar->cur_dirstr));
	archive_string_ensure(&(xar->cur_dirstr), 1);
	xar->cur_dirstr.s[0] = 0;

	/*
	 * Initialize option.
	 */
	/* Set default checksum type. */
	xar->opt_toc_sumalg = CKSUM_SHA1;
	xar->opt_sumalg = CKSUM_SHA1;
	/* Set default compression type, level, and number of threads. */
	xar->opt_compression = GZIP;
	xar->opt_compression_level = 6;
	xar->opt_threads = 1;

	a->format_data = xar;

	a->format_name = "xar";
	a->format_options = xar_options;
	a->format_write_header = xar_write_header;
	a->format_write_data = xar_write_data;
	a->format_finish_entry = xar_finish_entry;
	a->format_close = xar_close;
	a->format_free = xar_free;
	a->archive.archive_format = ARCHIVE_FORMAT_XAR;
	a->archive.archive_format_name = "xar";

	return (ARCHIVE_OK);
}